

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasmtool.c
# Opt level: O0

_Bool parse_arguments(int argc,char **argv,DISASM_OPTIONS *Options)

{
  _Bool _Var1;
  int iVar2;
  ulonglong uVar3;
  long in_FS_OFFSET;
  int local_34;
  int i;
  DISASM_OPTIONS *Options_local;
  char **argv_local;
  _Bool local_15;
  int argc_local;
  long lStack_10;
  DWORD gprIdx;
  
  lStack_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((argc < 2) || (argv == (char **)0x0)) {
    print_help();
    local_15 = false;
  }
  else {
    memset(Options,0,0x148);
    Options->Command = commandDecode;
    Options->Mode = '\x02';
    Options->Ring = '\x03';
    Options->Print = true;
    Options->Vendor = '\0';
    Options->Feature = 0xff;
    Options->SkipWriteDecoded = false;
    for (local_34 = 1; local_34 < argc; local_34 = local_34 + 1) {
      _Var1 = match_gpr(argv[local_34],(DWORD *)&argc_local);
      if (_Var1) {
        if (local_34 + 1 < argc) {
          uVar3 = strtoull(argv[local_34 + 1],(char **)0x0,0);
          Options->ShemuRegs[(uint)argc_local] = uVar3;
          Options->UseShemuRegs = true;
          local_34 = local_34 + 1;
        }
        else {
          printf("No value given for %s!\n",argv[local_34]);
        }
      }
      else {
        iVar2 = strcmp(argv[local_34],"shemu");
        if (iVar2 == 0) {
          Options->Command = commandShemu;
        }
        else {
          iVar2 = strcmp(argv[local_34],"decode");
          if (iVar2 == 0) {
            Options->Command = commandDecode;
          }
          else if (((*argv[local_34] == '-') && (argv[local_34][1] == 'f')) &&
                  (argv[local_34][2] == '\0')) {
            if (local_34 + 1 < argc) {
              Options->InputMode = inputFile;
              Options->FileName = argv[local_34 + 1];
              local_34 = local_34 + 1;
            }
          }
          else if (((*argv[local_34] == '-') && (argv[local_34][1] == 'h')) &&
                  (argv[local_34][2] == '\0')) {
            if (local_34 + 1 < argc) {
              Options->InputMode = inputHex;
              Options->FileName = argv[local_34 + 1];
              local_34 = local_34 + 1;
            }
          }
          else if (((*argv[local_34] == '-') && (argv[local_34][1] == 'o')) &&
                  (argv[local_34][2] == '\0')) {
            if (local_34 + 1 < argc) {
              uVar3 = strtoull(argv[local_34 + 1],(char **)0x0,0);
              Options->Offset = uVar3;
              local_34 = local_34 + 1;
            }
          }
          else if (((*argv[local_34] == '-') && (argv[local_34][1] == 'r')) &&
                  (argv[local_34][2] == '\0')) {
            if (local_34 + 1 < argc) {
              uVar3 = strtoull(argv[local_34 + 1],(char **)0x0,0);
              Options->Rip = uVar3;
              local_34 = local_34 + 1;
            }
          }
          else if (((*argv[local_34] == '-') && (argv[local_34][1] == 'k')) &&
                  (argv[local_34][2] == '\0')) {
            Options->Ring = '\0';
          }
          else if (((*argv[local_34] == '-') && (argv[local_34][1] == 'b')) &&
                  ((argv[local_34][2] == 'w' && (argv[local_34][3] == '\0')))) {
            Options->BypassSelfWrites = true;
          }
          else {
            iVar2 = strcmp(argv[local_34],"-b16");
            if (iVar2 == 0) {
              Options->Mode = '\0';
            }
            else {
              iVar2 = strcmp(argv[local_34],"-b32");
              if (iVar2 == 0) {
                Options->Mode = '\x01';
              }
              else {
                iVar2 = strcmp(argv[local_34],"-b64");
                if (iVar2 == 0) {
                  Options->Mode = '\x02';
                }
                else {
                  iVar2 = strcmp(argv[local_34],"-v intel");
                  if (iVar2 == 0) {
                    Options->Vendor = '\x01';
                  }
                  else {
                    iVar2 = strcmp(argv[local_34],"-v amd");
                    if (iVar2 == 0) {
                      Options->Vendor = '\x02';
                    }
                    else {
                      iVar2 = strcmp(argv[local_34],"-v any");
                      if (iVar2 == 0) {
                        Options->Vendor = '\0';
                      }
                      else {
                        iVar2 = strcmp(argv[local_34],"-t all");
                        if (iVar2 == 0) {
                          Options->Feature = 0xff;
                        }
                        else {
                          iVar2 = strcmp(argv[local_34],"-t mpx");
                          if (iVar2 == 0) {
                            if (Options->Feature == 0xff) {
                              Options->Feature = '\0';
                            }
                            Options->Feature = Options->Feature | 1;
                          }
                          else {
                            iVar2 = strcmp(argv[local_34],"-t cet");
                            if (iVar2 == 0) {
                              if (Options->Feature == 0xff) {
                                Options->Feature = '\0';
                              }
                              Options->Feature = Options->Feature | 2;
                            }
                            else {
                              iVar2 = strcmp(argv[local_34],"-t cldm");
                              if (iVar2 == 0) {
                                if (Options->Feature == 0xff) {
                                  Options->Feature = '\0';
                                }
                                Options->Feature = Options->Feature | 4;
                              }
                              else {
                                iVar2 = strcmp(argv[local_34],"-t piti");
                                if (iVar2 == 0) {
                                  if (Options->Feature == 0xff) {
                                    Options->Feature = '\0';
                                  }
                                  Options->Feature = Options->Feature | 8;
                                }
                                else {
                                  iVar2 = strcmp(argv[local_34],"-t none");
                                  if (iVar2 == 0) {
                                    Options->Feature = '\0';
                                  }
                                  else {
                                    iVar2 = strcmp(argv[local_34],"-nv");
                                    if (iVar2 == 0) {
                                      Options->Print = false;
                                    }
                                    else {
                                      iVar2 = strcmp(argv[local_34],"-hl");
                                      if (iVar2 == 0) {
                                        Options->Highlight = true;
                                      }
                                      else {
                                        iVar2 = strcmp(argv[local_34],"-iv");
                                        if (iVar2 == 0) {
                                          Options->Stats = true;
                                        }
                                        else {
                                          iVar2 = strcmp(argv[local_34],"-exi");
                                          if (iVar2 == 0) {
                                            Options->ExtendedInfo = true;
                                          }
                                          else {
                                            iVar2 = strcmp(argv[local_34],"-bits");
                                            if (iVar2 == 0) {
                                              Options->BitFields = true;
                                            }
                                            else {
                                              iVar2 = strcmp(argv[local_34],"-skip16");
                                              if (iVar2 == 0) {
                                                Options->Skip16 = true;
                                              }
                                              else {
                                                iVar2 = strcmp(argv[local_34],"-skip1");
                                                if (iVar2 == 0) {
                                                  Options->Skip1 = true;
                                                }
                                                else {
                                                  iVar2 = strcmp(argv[local_34],"-skipdecoded");
                                                  if (iVar2 == 0) {
                                                    Options->SkipWriteDecoded = true;
                                                  }
                                                  else {
                                                    printf("Unknown option: \'%s\'\n",argv[local_34]
                                                          );
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    _Var1 = parse_input(Options);
    if (_Var1) {
      local_15 = true;
    }
    else {
      printf("Could not find a valid input!\n");
      local_15 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_10) {
    __stack_chk_fail();
  }
  return local_15;
}

Assistant:

_Success_(return)
bool
parse_arguments(
    _In_ int argc,
    _In_ char* argv[],
    _Out_ DISASM_OPTIONS *Options
    )
{
    int i;

    if (argc < 2 || NULL == argv)
    {
        print_help();
        return false;
    }

    memset(Options, 0, sizeof(*Options));

    // Initialize default options.
    Options->Command = commandDecode;
    Options->Mode = ND_CODE_64;
    Options->Ring = 3;
    Options->Print = true;
    Options->Vendor = ND_VEND_ANY;
    Options->Feature = ND_FEAT_ALL;
    Options->SkipWriteDecoded = false;

    i = 1;
    while (i < argc)
    {       
        DWORD gprIdx;

        if (match_gpr(argv[i], &gprIdx))
        {
            // Register value (used by shemu).
            if (i + 1 >= argc)
            {
                printf("No value given for %s!\n", argv[i]);
            }
            else
            {
                Options->ShemuRegs[gprIdx] = (size_t)strtoull(argv[i + 1], NULL, 0);
                Options->UseShemuRegs = true;
                i++;
            }
        }
        else if (strcmp(argv[i], "shemu") == 0)
        {
            // shemu command - will emulate.
            Options->Command = commandShemu;
        }
        else if (strcmp(argv[i], "decode") == 0)
        {
            // decode command.
            Options->Command = commandDecode;
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'f' && argv[i][2] == 0)
        {
            // File input mode.
            if (i + 1 < argc)
            {
                Options->InputMode = inputFile;
                Options->FileName = argv[i + 1];
                i++;
            }
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'h' && argv[i][2] == 0)
        {
            // Hex-string input mode.
            if (i + 1 < argc)
            {
                Options->InputMode = inputHex;
                Options->FileName = argv[i + 1];
                i++;
            }
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'o' && argv[i][2] == 0)
        {
            // Offset inside the provided buffer.
            if (i + 1 < argc)
            {
                Options->Offset = (size_t)strtoull(argv[i + 1], NULL, 0);
                i++;
            }
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'r' && argv[i][2] == 0)
        {
            // Rip. Can be any value, as it's used only for disassembly.
            if (i + 1 < argc)
            {
                Options->Rip = (size_t)strtoull(argv[i + 1], NULL, 0);
                i++;
            }
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'k' && argv[i][2] == 0)
        {
            // Kernel-mode for shemu.
            Options->Ring = 0;
        }
        else if (argv[i][0] == '-' && argv[i][1] == 'b' && argv[i][2] == 'w' && argv[i][3] == 0)
        {
            // Bypass self writes in shemu.
            Options->BypassSelfWrites = true;
        }
        else if (0 == strcmp(argv[i], "-b16"))
        {
            // 16-bit mode.
            Options->Mode = ND_CODE_16;
        } 
        else if (0 == strcmp(argv[i], "-b32"))
        {
            // 32-bit mode.
            Options->Mode = ND_CODE_32;
        } 
        else if (0 == strcmp(argv[i], "-b64"))
        {
            // 64-bit mode.
            Options->Mode = ND_CODE_64;
        }
        else if (0 == strcmp(argv[i], "-v intel"))
        {
            // Prefer Intel instructions.
            Options->Vendor = ND_VEND_INTEL;
        }
        else if (0 == strcmp(argv[i], "-v amd"))
        {
            // Prefer AMD instructions.
            Options->Vendor = ND_VEND_AMD;
        }
        else if (0 == strcmp(argv[i], "-v any"))
        {
            // Try to decode everything.
            Options->Vendor = ND_VEND_ANY;
        }
        else if (0 == strcmp(argv[i], "-t all"))
        {
            // Enable all features.
            Options->Feature = ND_FEAT_ALL;
        }
        else if (0 == strcmp(argv[i], "-t mpx"))
        {
            // Enable MPX. 
            if (Options->Feature == ND_FEAT_ALL)
            {
                Options->Feature = 0;
            }

            Options->Feature |= ND_FEAT_MPX;
        }
        else if (0 == strcmp(argv[i], "-t cet"))
        {
            // Enable CET.
            if (Options->Feature == ND_FEAT_ALL)
            {
                Options->Feature = 0;
            }

            Options->Feature |= ND_FEAT_CET;
        }
        else if (0 == strcmp(argv[i], "-t cldm"))
        {
            // Enable Cache Line Demote.
            if (Options->Feature == ND_FEAT_ALL)
            {
                Options->Feature = 0;
            }

            Options->Feature |= ND_FEAT_CLDEMOTE;
        }
        else if (0 == strcmp(argv[i], "-t piti"))
        {
            // Enable Prefetch for instruction fetch.
            if (Options->Feature == ND_FEAT_ALL)
            {
                Options->Feature = 0;
            }

            Options->Feature |= ND_FEAT_PITI;
        }
        else if (0 == strcmp(argv[i], "-t none"))
        {
            // No feature support.
            Options->Feature = ND_FEAT_NONE;
        }
        else if (0 == strcmp(argv[i], "-nv"))
        {
            // Do not print anything.
            Options->Print = false;
        } 
        else if (0 == strcmp(argv[i], "-hl"))
        {
            // Highlight instruction components.
            Options->Highlight = true;
        }
        else if (0 == strcmp(argv[i], "-iv"))
        {
            // Print statistics.
            Options->Stats = true;
        }
        else if (0 == strcmp(argv[i], "-exi"))
        {
            // Print extended instruction information.
            Options->ExtendedInfo = true;
        }
        else if (0 == strcmp(argv[i], "-bits"))
        {
            // Print instruction bitfields.
            Options->BitFields = true;
        }
        else if (0 == strcmp(argv[i], "-skip16"))
        {
            // Skip 16 bytes after each decoded instruction.
            Options->Skip16 = true;
        }
        else if (0 == strcmp(argv[i], "-skip1"))
        {
            // Skip a single byte after each decoded instruction.
            Options->Skip1 = true;
        }
        else if (0 == strcmp(argv[i], "-skipdecoded"))
        {
            Options->SkipWriteDecoded = true;
        }
        else
        {
            printf("Unknown option: '%s'\n", argv[i]);
        }

        i++;
    }

    // Parse the input.
    if (!parse_input(Options))
    {
        printf("Could not find a valid input!\n");
        return false;
    }

    return true;
}